

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O3

ly_bool lyd_validate_autodel_node_del
                  (lyd_node **first,lyd_node *del,lys_module *mod,int np_cont_diff,lyd_node **node,
                  ly_set *node_when,ly_set *node_types,lyd_node **diff)

{
  lyd_node_inner *plVar1;
  ly_bool lVar2;
  undefined8 in_RAX;
  lyd_node *plVar3;
  lyd_node_inner *plVar4;
  ly_bool lVar5;
  lyd_node *plVar6;
  uint32_t idx;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  lyd_del_move_root(first,del,mod);
  if ((node == (lyd_node **)0x0) || (*node != del)) {
    lVar5 = '\0';
  }
  else {
    *node = (*node)->next;
    lVar5 = '\x01';
  }
  if (diff != (lyd_node **)0x0) {
    if (((np_cont_diff == 0) && (del->schema->nodetype == 1)) && ((del->schema->flags & 0x80) == 0))
    {
      for (plVar6 = *(lyd_node **)(del + 1); plVar6 != (lyd_node *)0x0; plVar6 = plVar6->next) {
        lyd_val_diff_add(plVar6,LYD_DIFF_OP_DELETE,diff);
      }
    }
    else {
      lyd_val_diff_add(del,LYD_DIFF_OP_DELETE,diff);
    }
  }
  if ((node_when != (ly_set *)0x0) && (del != (lyd_node *)0x0 && node_when->count != 0)) {
    plVar6 = del;
    while( true ) {
      do {
        plVar3 = plVar6;
        if ((plVar3 != del) &&
           (lVar2 = ly_set_contains(node_when,plVar3,(uint32_t *)((long)&uStack_38 + 4)),
           lVar2 != '\0')) {
          ly_set_rm_index(node_when,uStack_38._4_4_,(_func_void_void_ptr *)0x0);
        }
      } while (((plVar3->schema == (lysc_node *)0x0) || ((plVar3->schema->nodetype & 0x711) != 0))
              && (plVar6 = *(lyd_node **)(plVar3 + 1), *(lyd_node **)(plVar3 + 1) != (lyd_node *)0x0
                 ));
      if (plVar3 == del) break;
      plVar6 = plVar3->next;
      if (plVar3->next == (lyd_node *)0x0) {
        plVar4 = plVar3->parent;
        do {
          plVar1 = (plVar4->field_0).node.parent;
          if (plVar1 == del->parent) goto LAB_001b6ef8;
          plVar6 = (plVar4->field_0).node.next;
          plVar4 = plVar1;
        } while (plVar6 == (lyd_node *)0x0);
      }
    }
  }
LAB_001b6ef8:
  if ((node_types != (ly_set *)0x0) && (del != (lyd_node *)0x0 && node_types->count != 0)) {
    plVar6 = del;
    while( true ) {
      do {
        plVar3 = plVar6;
        lVar2 = ly_set_contains(node_types,plVar3,(uint32_t *)((long)&uStack_38 + 4));
        if (lVar2 != '\0') {
          ly_set_rm_index(node_types,uStack_38._4_4_,(_func_void_void_ptr *)0x0);
        }
      } while (((plVar3->schema == (lysc_node *)0x0) || ((plVar3->schema->nodetype & 0x711) != 0))
              && (plVar6 = *(lyd_node **)(plVar3 + 1), *(lyd_node **)(plVar3 + 1) != (lyd_node *)0x0
                 ));
      if (plVar3 == del) break;
      plVar6 = plVar3->next;
      if (plVar3->next == (lyd_node *)0x0) {
        plVar4 = plVar3->parent;
        do {
          plVar1 = (plVar4->field_0).node.parent;
          if (plVar1 == del->parent) goto LAB_001b6f13;
          plVar6 = (plVar4->field_0).node.next;
          plVar4 = plVar1;
        } while (plVar6 == (lyd_node *)0x0);
      }
    }
  }
LAB_001b6f13:
  lyd_free_tree(del);
  return lVar5;
}

Assistant:

static ly_bool
lyd_validate_autodel_node_del(struct lyd_node **first, struct lyd_node *del, const struct lys_module *mod,
        int np_cont_diff, struct lyd_node **node, struct ly_set *node_when, struct ly_set *node_types, struct lyd_node **diff)
{
    struct lyd_node *iter;
    ly_bool node_autodel = 0;
    uint32_t idx;

    /* update pointers */
    lyd_del_move_root(first, del, mod);
    if (node && (del == *node)) {
        *node = (*node)->next;
        node_autodel = 1;
    }

    if (diff) {
        /* add into diff */
        if (!np_cont_diff && (del->schema->nodetype == LYS_CONTAINER) && !(del->schema->flags & LYS_PRESENCE)) {
            /* we do not want to track NP container changes, but remember any removed children */
            LY_LIST_FOR(lyd_child(del), iter) {
                lyd_val_diff_add(iter, LYD_DIFF_OP_DELETE, diff);
            }
        } else {
            lyd_val_diff_add(del, LYD_DIFF_OP_DELETE, diff);
        }
    }

    if (node_when && node_when->count) {
        /* remove nested from node_when set */
        LYD_TREE_DFS_BEGIN(del, iter) {
            if ((del != iter) && ly_set_contains(node_when, iter, &idx)) {
                ly_set_rm_index(node_when, idx, NULL);
            }
            LYD_TREE_DFS_END(del, iter);
        }
    }

    if (node_types && node_types->count) {
        /* remove from node_types set */
        LYD_TREE_DFS_BEGIN(del, iter) {
            if (ly_set_contains(node_types, iter, &idx)) {
                ly_set_rm_index(node_types, idx, NULL);
            }
            LYD_TREE_DFS_END(del, iter);
        }
    }

    /* free */
    lyd_free_tree(del);

    return node_autodel;
}